

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_node.c
# Opt level: O3

void JPCommonNode_initialize(JPCommonNode *node)

{
  node->ctype = (char *)0x0;
  node->cform = (char *)0x0;
  node->pron = (char *)0x0;
  node->pos = (char *)0x0;
  node->acc = 0;
  node->chain_flag = -1;
  node->prev = (_JPCommonNode *)0x0;
  node->next = (_JPCommonNode *)0x0;
  return;
}

Assistant:

void JPCommonNode_initialize(JPCommonNode * node)
{
   node->pron = NULL;
   node->pos = NULL;
   node->ctype = NULL;
   node->cform = NULL;
   node->acc = 0;
   node->chain_flag = -1;
   node->prev = NULL;
   node->next = NULL;
}